

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void funcstat(LexState *ls,int line)

{
  int ismethod_00;
  undefined1 local_48 [8];
  expdesc b;
  expdesc v;
  int ismethod;
  int line_local;
  LexState *ls_local;
  
  luaX_next(ls);
  ismethod_00 = funcname(ls,(expdesc *)&b.t);
  body(ls,(expdesc *)local_48,ismethod_00,line);
  check_readonly(ls,(expdesc *)&b.t);
  luaK_storevar(ls->fs,(expdesc *)&b.t,(expdesc *)local_48);
  luaK_fixline(ls->fs,line);
  return;
}

Assistant:

static void funcstat (LexState *ls, int line) {
  /* funcstat -> FUNCTION funcname body */
  int ismethod;
  expdesc v, b;
  luaX_next(ls);  /* skip FUNCTION */
  ismethod = funcname(ls, &v);
  body(ls, &b, ismethod, line);
  check_readonly(ls, &v);
  luaK_storevar(ls->fs, &v, &b);
  luaK_fixline(ls->fs, line);  /* definition "happens" in the first line */
}